

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

CosLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::CosLayerParams>(Arena *arena)

{
  CosLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (CosLayerParams *)operator_new(0x18);
    CoreML::Specification::CosLayerParams::CosLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (CosLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,(type_info *)&CoreML::Specification::CosLayerParams::typeinfo);
    CoreML::Specification::CosLayerParams::CosLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }